

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedjson.cpp
# Opt level: O2

bool __thiscall ParsedJson::printjson(ParsedJson *this,ostream *os)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  size_t sStack_60;
  ulong local_40;
  
  if (this->isvalid == true) {
    if ((char)(*this->tape >> 0x38) == 'r') {
      uVar3 = *this->tape & 0xffffffffffffff;
      if (uVar3 <= this->tapecapacity) {
        uVar8 = this->depthcapacity;
        pvVar4 = operator_new__(uVar8);
        pvVar5 = operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 << 3);
        *(undefined8 *)((long)pvVar5 + 8) = 0;
        *(undefined1 *)((long)pvVar4 + 1) = 0;
        uVar8 = 1;
        local_40 = 1;
        do {
          if (uVar3 <= uVar8) {
            operator_delete__(pvVar4);
            operator_delete__(pvVar5);
            return true;
          }
          uVar1 = this->tape[uVar8];
          lVar9 = (long)(int)local_40;
          uVar6 = *(ulong *)((long)pvVar5 + lVar9 * 8);
          cVar2 = (char)(uVar1 >> 0x38);
          if (*(char *)((long)pvVar4 + lVar9) == '\0') {
            if ((uVar6 != 0) && (pcVar7 = ",", cVar2 != ']')) {
LAB_001070bc:
              std::operator<<(os,pcVar7);
              uVar6 = *(ulong *)((long)pvVar5 + lVar9 * 8);
            }
          }
          else if (uVar6 == 0) {
            uVar6 = 0;
          }
          else {
            if (((uVar6 & 1) == 0) && (cVar2 != '}')) {
              std::operator<<(os,",");
              uVar6 = *(ulong *)((long)pvVar5 + lVar9 * 8);
            }
            pcVar7 = ":";
            if ((uVar6 & 1) != 0) goto LAB_001070bc;
          }
          *(ulong *)((long)pvVar5 + lVar9 * 8) = uVar6 + 1;
          switch(cVar2) {
          case 'l':
            if (uVar3 <= uVar8 + 1) goto LAB_00107311;
            std::ostream::_M_insert<long>((long)os);
LAB_00107239:
            uVar8 = uVar8 + 1;
            break;
          case 'm':
          case 'o':
          case 'p':
          case 'q':
          case 's':
switchD_00107166_caseD_6d:
            fprintf(_stderr,"bug %c\n",uVar1 >> 0x38);
            operator_delete__(pvVar4);
            operator_delete__(pvVar5);
            return false;
          case 'n':
            pcVar7 = "null";
            goto LAB_001071de;
          case 'r':
            fwrite("should we be hitting the root node?\n",0x24,1,_stderr);
LAB_00107311:
            operator_delete__(pvVar4);
            operator_delete__(pvVar5);
            return false;
          case 't':
            pcVar7 = "true";
LAB_001071de:
            std::operator<<(os,pcVar7);
            break;
          default:
            if (cVar2 == '}') {
              cVar2 = '}';
LAB_00107266:
              local_40 = (ulong)((int)local_40 - 1);
              std::operator<<(os,cVar2);
            }
            else if (cVar2 == '[') {
              std::operator<<(os,'[');
              *(undefined1 *)((long)pvVar4 + lVar9 + 1) = 0;
LAB_00107209:
              local_40 = lVar9 + 1;
              *(undefined8 *)((long)pvVar5 + lVar9 * 8 + 8) = 0;
            }
            else {
              if (cVar2 == ']') {
                cVar2 = ']';
                goto LAB_00107266;
              }
              if (cVar2 == 'd') {
                if (uVar3 <= uVar8 + 1) goto LAB_00107311;
                std::ostream::_M_insert<double>((double)this->tape[uVar8 + 1]);
                goto LAB_00107239;
              }
              if (cVar2 == 'f') {
                pcVar7 = "false";
                goto LAB_001071de;
              }
              if (cVar2 == '{') {
                std::operator<<(os,'{');
                *(undefined1 *)((long)pvVar4 + lVar9 + 1) = 1;
                goto LAB_00107209;
              }
              if (cVar2 != '\"') goto switchD_00107166_caseD_6d;
              std::operator<<(os,'\"');
              print_with_escapes(this->string_buf + (uVar1 & 0xffffffffffffff));
              std::operator<<(os,'\"');
            }
          }
          uVar8 = uVar8 + 1;
        } while( true );
      }
      pcVar7 = "We may be exceeding the tape capacity. Is this a valid document?\n";
      sStack_60 = 0x41;
    }
    else {
      pcVar7 = "Error: no starting root node?";
      sStack_60 = 0x1d;
    }
    fwrite(pcVar7,sStack_60,1,_stderr);
  }
  return false;
}

Assistant:

WARN_UNUSED
bool ParsedJson::printjson(std::ostream &os) {
    if(!isvalid) { 
      return false;
    }
    size_t tapeidx = 0;
    uint64_t tape_val = tape[tapeidx];
    uint8_t type = (tape_val >> 56);
    size_t howmany = 0;
    if (type == 'r') {
      howmany = tape_val & JSONVALUEMASK;
    } else {
      fprintf(stderr, "Error: no starting root node?");
      return false;
    }
    if (howmany > tapecapacity) {
      fprintf(stderr,
          "We may be exceeding the tape capacity. Is this a valid document?\n");
      return false;
    }
    tapeidx++;
    bool *inobject = new bool[depthcapacity];
    auto *inobjectidx = new size_t[depthcapacity];
    int depth = 1; // only root at level 0
    inobjectidx[depth] = 0;
    inobject[depth] = false;
    for (; tapeidx < howmany; tapeidx++) {
      tape_val = tape[tapeidx];
      uint64_t payload = tape_val & JSONVALUEMASK;
      type = (tape_val >> 56);
      if (!inobject[depth]) {
        if ((inobjectidx[depth] > 0) && (type != ']')) {
          os << ",";
        }
        inobjectidx[depth]++;
      } else { // if (inobject) {
        if ((inobjectidx[depth] > 0) && ((inobjectidx[depth] & 1) == 0) &&
            (type != '}')) {
          os << ",";
        }
        if (((inobjectidx[depth] & 1) == 1)) {
          os << ":";
        }
        inobjectidx[depth]++;
      }
      switch (type) {
      case '"': // we have a string
        os << '"';
        print_with_escapes((const unsigned char *)(string_buf + payload));
        os << '"';
        break;
      case 'l': // we have a long int
        if (tapeidx + 1 >= howmany) {
          delete[] inobject;
          delete[] inobjectidx;
          return false;
        }
        os <<  static_cast<int64_t>(tape[++tapeidx]);
        break;
      case 'd': // we have a double
        if (tapeidx + 1 >= howmany){
          delete[] inobject;
          delete[] inobjectidx;
          return false;
        }
        double answer;
        memcpy(&answer, &tape[++tapeidx], sizeof(answer));
        os << answer;
        break;
      case 'n': // we have a null
        os << "null";
        break;
      case 't': // we have a true
        os << "true";
        break;
      case 'f': // we have a false
        os << "false";
        break;
      case '{': // we have an object
        os << '{';
        depth++;
        inobject[depth] = true;
        inobjectidx[depth] = 0;
        break;
      case '}': // we end an object
        depth--;
        os << '}';
        break;
      case '[': // we start an array
        os << '[';
        depth++;
        inobject[depth] = false;
        inobjectidx[depth] = 0;
        break;
      case ']': // we end an array
        depth--;
        os << ']';
        break;
      case 'r': // we start and end with the root node
        fprintf(stderr, "should we be hitting the root node?\n");
        delete[] inobject;
        delete[] inobjectidx;
        return false;
      default:
        fprintf(stderr, "bug %c\n", type);
        delete[] inobject;
        delete[] inobjectidx;
        return false;
      }
    }
    delete[] inobject;
    delete[] inobjectidx;
    return true;
}